

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O3

int h264_rem_intra_pred_mode(bitstream *str,h264_cabac_context *cabac,uint32_t *val)

{
  int iVar1;
  uint *binVal;
  long lVar2;
  uint32_t bit [3];
  uint local_34 [3];
  
  if (cabac == (h264_cabac_context *)0x0) {
    iVar1 = vs_u(str,val,3);
    return iVar1;
  }
  binVal = local_34;
  lVar2 = 0;
  do {
    *binVal = (uint)((*val >> ((uint)lVar2 & 0x1f) & 1) != 0);
    iVar1 = h264_cabac_decision(str,cabac,0x45,binVal);
    if (iVar1 != 0) {
      return 1;
    }
    lVar2 = lVar2 + 1;
    binVal = binVal + 1;
  } while (lVar2 != 3);
  if (str->dir == VS_DECODE) {
    *val = local_34[2] << 2 | local_34[1] * 2 | local_34[0];
  }
  return 0;
}

Assistant:

int h264_rem_intra_pred_mode(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *val) {
	if (!cabac)
		return vs_u(str, val, 3);
	uint32_t bit[3];
	int i;
	for (i = 0; i < 3; i++) {
		bit[i] = *val >> i & 1;
		if (h264_cabac_decision(str, cabac, H264_CABAC_CTXIDX_REM_INTRA_PRED_MODE, &bit[i])) return 1;
	}
	if (str->dir == VS_DECODE) {
		*val = bit[0] | bit[1] << 1 | bit[2] << 2;
	}
	return 0;
}